

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O2

void __thiscall github111116::ConsoleLogger::debug<char[35]>(ConsoleLogger *this,char (*args) [35])

{
  std::mutex::lock(&this->mtx);
  if (this->colored == true) {
    std::operator<<(this->out,(string *)&this->debugColor);
  }
  std::operator<<(this->out,"... ");
  print<char[35]>(this,args);
  if (this->colored == true) {
    std::operator<<(this->out,"\x1b[0m");
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return;
}

Assistant:

void ConsoleLogger::debug(const Args&... args)
{
#ifndef NDEBUG
	mtx.lock();
	if (colored) out << debugColor;
	out << "... ";
	print(args...);
	if (colored) out << "\033[0m";
	mtx.unlock();
#endif
}